

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

void __thiscall
SFFile::ApplyGeneratorsToRegion
          (SFFile *this,SFGenComposite *gen,SFSample *sfsamp,Renderer *song,Sample *sp)

{
  short sVar1;
  short sVar2;
  int a;
  int a_00;
  int iVar3;
  double dVar4;
  int end;
  int start;
  Sample *sp_local;
  Renderer *song_local;
  SFSample *sfsamp_local;
  SFGenComposite *gen_local;
  SFFile *this_local;
  
  sp->type = '\x02';
  sVar1 = gen->endAddrsOffset;
  sVar2 = gen->endAddrsCoarseOffset;
  a = MAX<int>(sfsamp->Start,
               sfsamp->Start + (int)gen->startAddrsOffset + gen->startAddrsCoarseOffset * 0x8000);
  a_00 = MIN<int>(sfsamp->End,sfsamp->End + (int)sVar1 + sVar2 * 0x8000);
  iVar3 = MAX<int>(a,sfsamp->StartLoop + (int)gen->startLoopAddrsOffset +
                     gen->startLoopAddrsCoarseOffset * 0x8000);
  sp->loop_start = iVar3;
  iVar3 = MIN<int>(a_00,sfsamp->EndLoop + (int)gen->endLoopAddrsOffset +
                        gen->endLoopAddrsCoarseOffset * 0x8000);
  sp->loop_end = iVar3;
  sp->loop_start = (sp->loop_start - a) * 0x1000;
  sp->loop_end = (sp->loop_end - a) * 0x1000;
  sp->data_length = (a_00 - a) * 0x1000;
  sp->data = sfsamp->InMemoryData + ((long)a - (ulong)sfsamp->Start);
  if ((gen->overridingRootKey < 0) || (0x7f < gen->overridingRootKey)) {
    sp->scale_note = (ushort)sfsamp->OriginalPitch;
  }
  else {
    sp->scale_note = gen->overridingRootKey;
  }
  dVar4 = pow(2.0,(double)(int)sp->scale_note / 12.0);
  sp->root_freq = (float)(dVar4 * 8175.798947309669);
  sp->sample_rate = sfsamp->SampleRate;
  sp->key_group = gen->exclusiveClass;
  if ((gen->keynum < 0) || (0x7f < gen->keynum)) {
    if (gen->scaleTuning < 0) {
      sp->scale_factor = 0x400;
      sp->scale_note = 0x3c;
    }
    else {
      sp->scale_factor = (WORD)((long)((int)gen->scaleTuning << 10) / 100);
    }
  }
  else {
    sp->scale_note = gen->keynum;
    sp->scale_factor = 0;
  }
  sp->panning = gen->pan;
  (sp->envelope).sf2.delay_vol = gen->delayVolEnv;
  (sp->envelope).sf2.attack_vol = gen->attackVolEnv;
  (sp->envelope).sf2.hold_vol = gen->holdVolEnv;
  (sp->envelope).sf2.decay_vol = gen->decayVolEnv;
  (sp->envelope).sf2.sustain_vol = gen->sustainVolEnv;
  (sp->envelope).sf2.release_vol = gen->releaseVolEnv;
  if (gen->sampleModes == 1) {
    sp->modes = 100;
  }
  else if (gen->sampleModes == 3) {
    sp->modes = 0x24;
  }
  else {
    sp->modes = 0x20;
  }
  sp->tune = gen->coarseTune * 100 + gen->fineTune;
  sp->velocity = (SBYTE)gen->velocity;
  sp->initial_attenuation = (float)(int)gen->initialAttenuation;
  return;
}

Assistant:

void SFFile::ApplyGeneratorsToRegion(SFGenComposite *gen, SFSample *sfsamp, Renderer *song, Sample *sp)
{
	sp->type = INST_SF2;

	// Set loop and sample points
	int start, end;
	start = gen->startAddrsOffset + gen->startAddrsCoarseOffset * 32768;
	end = gen->endAddrsOffset + gen->endAddrsCoarseOffset * 32768;
	start = MAX<int>(sfsamp->Start, sfsamp->Start + start);
	end = MIN<int>(sfsamp->End, sfsamp->End + end);
	sp->loop_start = MAX<int>(start, sfsamp->StartLoop + gen->startLoopAddrsOffset + gen->startLoopAddrsCoarseOffset * 32768);
	sp->loop_end = MIN<int>(end, sfsamp->EndLoop + gen->endLoopAddrsOffset + gen->endLoopAddrsCoarseOffset * 32768);

	sp->loop_start = (sp->loop_start - start) << FRACTION_BITS;
	sp->loop_end = (sp->loop_end - start) << FRACTION_BITS;
	sp->data_length = (end - start) << FRACTION_BITS;
	sp->data = sfsamp->InMemoryData + start - sfsamp->Start;
	if (gen->overridingRootKey >= 0 && gen->overridingRootKey <= 127)
	{
		sp->scale_note = gen->overridingRootKey;
	}
	else
	{
		sp->scale_note = sfsamp->OriginalPitch;
	}
	sp->root_freq = note_to_freq(sp->scale_note);
	sp->sample_rate = sfsamp->SampleRate;
	sp->key_group = gen->exclusiveClass;

	// Set key scaling
	if (gen->keynum >= 0 && gen->keynum <= 127)
	{
		sp->scale_note = gen->keynum;
		sp->scale_factor = 0;
	}
	else if (gen->scaleTuning >= 0)
	{
		sp->scale_factor = gen->scaleTuning * 1024 / 100;
		// Does the root key also serve as the scale key? Assuming it does here.
	}
	else
	{
		sp->scale_factor = 1024;
		sp->scale_note = 60;
	}

	// Set panning
	sp->panning = gen->pan;

	// Set volume envelope
	sp->envelope.sf2.delay_vol = gen->delayVolEnv;
	sp->envelope.sf2.attack_vol = gen->attackVolEnv;
	sp->envelope.sf2.hold_vol = gen->holdVolEnv;
	sp->envelope.sf2.decay_vol = gen->decayVolEnv;
	sp->envelope.sf2.sustain_vol = gen->sustainVolEnv;
	sp->envelope.sf2.release_vol = gen->releaseVolEnv;

	// Set sample modes
	if (gen->sampleModes == 1)
	{
		sp->modes = PATCH_LOOPEN | PATCH_SUSTAIN | PATCH_NO_SRELEASE;
	}
	else if (gen->sampleModes == 3)
	{
		sp->modes = PATCH_LOOPEN | PATCH_SUSTAIN;
	}
	else
	{
		sp->modes = PATCH_SUSTAIN;
	}

	// Set tuning (in cents)
	sp->tune = gen->coarseTune * 100 + gen->fineTune;

	sp->velocity = (SBYTE)gen->velocity;
	sp->initial_attenuation = gen->initialAttenuation;
}